

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameworld.cpp
# Opt level: O3

void __thiscall CGameWorld::CGameWorld(CGameWorld *this)

{
  CTuningParams::CTuningParams(&(this->m_Core).m_Tuning);
  mem_zero((this->m_Core).m_apCharacters,0x200);
  this->m_pConfig = (CConfig *)0x0;
  this->m_pServer = (IServer *)0x0;
  this->m_apFirstEntityTypes[4] = (CEntity *)0x0;
  this->m_pGameServer = (CGameContext *)0x0;
  this->m_apFirstEntityTypes[2] = (CEntity *)0x0;
  this->m_apFirstEntityTypes[3] = (CEntity *)0x0;
  this->m_apFirstEntityTypes[0] = (CEntity *)0x0;
  this->m_apFirstEntityTypes[1] = (CEntity *)0x0;
  this->m_ResetRequested = false;
  this->m_Paused = false;
  return;
}

Assistant:

CGameWorld::CGameWorld()
{
	m_pGameServer = 0x0;
	m_pConfig = 0x0;
	m_pServer = 0x0;

	m_Paused = false;
	m_ResetRequested = false;
	for(int i = 0; i < NUM_ENTTYPES; i++)
		m_apFirstEntityTypes[i] = 0;
}